

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O1

uint64_t __thiscall GCSFilter::HashToRange(GCSFilter *this,Element *element)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  CSipHasher *this_00;
  uint64_t uVar4;
  long in_FS_OFFSET;
  Span<const_unsigned_char> data;
  CSipHasher local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CSipHasher::CSipHasher(&local_50,(this->m_params).m_siphash_k0,(this->m_params).m_siphash_k1);
  puVar1 = (element->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  data.m_size = (long)(element->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  data.m_data = puVar1;
  this_00 = CSipHasher::Write(&local_50,data);
  uVar4 = CSipHasher::Finalize(this_00);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->m_F;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return SUB168(auVar2 * auVar3,8);
  }
  __stack_chk_fail();
}

Assistant:

uint64_t GCSFilter::HashToRange(const Element& element) const
{
    uint64_t hash = CSipHasher(m_params.m_siphash_k0, m_params.m_siphash_k1)
        .Write(element)
        .Finalize();
    return FastRange64(hash, m_F);
}